

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O3

int __thiscall deqp::ShaderLibraryGroup::init(ShaderLibraryGroup *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  long lVar2;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderLibrary shaderLibrary;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> local_38;
  ShaderLibrary local_20;
  
  local_20.m_testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  local_20.m_renderCtx = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
  ShaderLibrary::loadShaderFile(&local_38,&local_20,(this->m_filename)._M_dataplus._M_p);
  iVar1 = (int)((ulong)((long)local_38.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_38.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      tcu::TestNode::addChild
                ((TestNode *)this,
                 local_38.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar2]);
      lVar2 = lVar2 + 1;
      iVar1 = (int)((ulong)((long)local_38.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_38.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (lVar2 < iVar1);
  }
  if (local_38.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void ShaderLibraryGroup::init(void)
{
	deqp::ShaderLibrary			shaderLibrary(m_testCtx, m_context.getRenderContext());
	std::vector<tcu::TestNode*> children = shaderLibrary.loadShaderFile(m_filename.c_str());

	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);
}